

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O3

void __thiscall
basisu::basisu_frontend::dump_endpoint_clusterization_visualization
          (basisu_frontend *this,char *pFilename,bool vis_endpoint_colors)

{
  endpoint_cluster_etc_params *peVar1;
  vector<unsigned_int> *pvVar2;
  pixel_block *ppVar3;
  anon_union_8_2_04352b30_for_etc_block_0 aVar4;
  uint16_t uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  uint32_t uVar10;
  undefined7 in_register_00000011;
  uint uVar11;
  void *__ptr;
  color_rgba *pBlock_colors;
  etc_block *this_00;
  uint uVar12;
  vector<unsigned_int> sorted_cluster_indices;
  vector<unsigned_int> cluster_sizes;
  color_rgba colors [2];
  image endpoint_cluster_vis;
  color_rgba subblock_pixels [8];
  color_rgba blk_colors [4];
  anon_union_8_2_04352b30_for_etc_block_0 local_e0;
  elemental_vector local_d8;
  undefined4 local_bc;
  elemental_vector local_b8;
  char *local_a0;
  ulong local_98;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_90 [2];
  image local_88;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_68 [8];
  color_rgba local_48 [6];
  
  local_bc = (undefined4)CONCAT71(in_register_00000011,vis_endpoint_colors);
  debug_printf("dump_endpoint_clusterization_visualization\n");
  uVar10 = (this->m_endpoint_clusters).m_size;
  local_b8.m_p = (void *)0x0;
  local_b8.m_size = 0;
  local_b8.m_capacity = 0;
  if (uVar10 == 0) {
    local_d8.m_p = (void *)0x0;
    local_d8.m_size = 0;
    local_d8.m_capacity = 0;
    __ptr = (void *)0x0;
  }
  else {
    elemental_vector::increase_capacity(&local_b8,uVar10,uVar10 == 1,4,(object_mover)0x0,false);
    memset((void *)((ulong)local_b8.m_size * 4 + (long)local_b8.m_p),0,
           (ulong)(uVar10 - local_b8.m_size) << 2);
    local_b8.m_size = uVar10;
    uVar10 = (this->m_endpoint_clusters).m_size;
    local_d8.m_p = (void *)0x0;
    local_d8.m_size = 0;
    local_d8.m_capacity = 0;
    __ptr = (void *)0x0;
    if (uVar10 != 0) {
      elemental_vector::increase_capacity(&local_d8,uVar10,uVar10 == 1,4,(object_mover)0x0,false);
      uVar12 = 0;
      memset((void *)((ulong)local_d8.m_size * 4 + (long)local_d8.m_p),0,
             (ulong)(uVar10 - local_d8.m_size) << 2);
      local_d8.m_size = uVar10;
      if ((this->m_endpoint_clusters).m_size != 0) {
        lVar7 = 8;
        uVar8 = 0;
        do {
          if (local_b8.m_size <= uVar8) goto LAB_0022bc76;
          uVar6 = *(uint *)((long)&((this->m_endpoint_clusters).m_p)->m_p + lVar7);
          if (uVar12 <= uVar6) {
            uVar12 = uVar6;
          }
          *(uint *)((long)local_b8.m_p + uVar8 * 4) = uVar6;
          uVar8 = uVar8 + 1;
          uVar6 = (this->m_endpoint_clusters).m_size;
          lVar7 = lVar7 + 0x10;
        } while (uVar8 < uVar6);
        if (uVar12 != 0) {
          if (uVar6 == 0) {
            uVar10 = 0;
          }
          else {
            uVar8 = 0;
            do {
              if (uVar10 <= uVar8) goto LAB_0022bc76;
              *(int *)((long)local_d8.m_p + uVar8 * 4) = (int)uVar8;
              uVar8 = uVar8 + 1;
              uVar6 = (this->m_endpoint_clusters).m_size;
            } while (uVar8 < uVar6);
            uVar10 = uVar6 * 3;
          }
          uVar6 = 0x800;
          if (uVar12 < 0x800) {
            uVar6 = uVar12;
          }
          local_a0 = pFilename;
          image::image(&local_88,uVar6 * 5 + 0xc,uVar10,0xffffffff);
          if ((this->m_endpoint_clusters).m_size != 0) {
            uVar8 = 0;
            do {
              pBlock_colors = local_48;
              if (local_d8.m_size <= (uint)uVar8) {
LAB_0022bc76:
                pcVar9 = "T &basisu::vector<unsigned int>::operator[](size_t) [T = unsigned int]";
LAB_0022bc6c:
                __assert_fail("i < m_size",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                              ,0x178,pcVar9);
              }
              uVar12 = *(uint *)((long)local_d8.m_p + uVar8 * 4);
              local_e0.m_uint64 = 0x2000000;
              if ((this->m_endpoint_cluster_etc_params).m_size <= uVar12) {
                pcVar9 = 
                "T &basisu::vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[](size_t) [T = basisu::basisu_frontend::endpoint_cluster_etc_params]"
                ;
                goto LAB_0022bc6c;
              }
              peVar1 = (this->m_endpoint_cluster_etc_params).m_p;
              uVar6 = peVar1[uVar12].m_inten_table[0];
              if (7 < uVar6) {
                __assert_fail("t < 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.h"
                              ,0xc1,"void basisu::etc_block::set_inten_table(uint32_t, uint32_t)");
              }
              local_e0.m_uint64 = (ulong)(byte)((char)(uVar6 << 2) * '\t') << 0x18 | 0x2000000;
              uVar5 = etc_block::pack_color5(peVar1[uVar12].m_color_unscaled,false,0x7f);
              aVar4 = local_e0;
              local_e0.m_bytes[1] = (byte)(uVar5 >> 2) & 0xf8 | local_e0.m_bytes[1] & 7;
              local_e0.m_bytes[0] = (byte)(uVar5 >> 7) & 0xf8 | local_e0.m_bytes[0] & 7;
              local_e0.m_bytes[2] = aVar4.m_bytes[2];
              local_e0.m_uint64._3_5_ = SUB85(aVar4.m_uint64,3);
              local_e0.m_bytes[2] = (char)uVar5 * '\b' | local_e0.m_bytes[2] & 7;
              etc_block::get_block_colors((etc_block *)&local_e0,pBlock_colors,0);
              uVar10 = (uint)uVar8 * 3;
              lVar7 = 0;
              do {
                image::fill_box(&local_88,(uint32_t)lVar7,uVar10,2,2,pBlock_colors);
                lVar7 = lVar7 + 2;
                pBlock_colors = pBlock_colors + 1;
              } while (lVar7 != 8);
              uVar6 = (this->m_endpoint_clusters).m_size;
              local_98 = uVar8;
              if (uVar6 <= uVar12) {
LAB_0022bc21:
                pcVar9 = 
                "T &basisu::vector<basisu::vector<unsigned int>>::operator[](size_t) [T = basisu::vector<unsigned int>]"
                ;
                goto LAB_0022bc6c;
              }
              pvVar2 = (this->m_endpoint_clusters).m_p;
              if (pvVar2[uVar12].m_size != 0) {
                uVar8 = 0;
                do {
                  uVar6 = pvVar2[uVar12].m_p[uVar8] >> 1;
                  if ((this->m_etc1_blocks_etc1s).m_size <= uVar6) {
                    pcVar9 = 
                    "T &basisu::vector<basisu::etc_block>::operator[](size_t) [T = basisu::etc_block]"
                    ;
                    goto LAB_0022bc6c;
                  }
                  if ((this->m_source_blocks).m_size <= uVar6) {
                    __assert_fail("i < m_size",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                                  ,0x177,
                                  "const T &basisu::vector<basisu::pixel_block>::operator[](size_t) const [T = basisu::pixel_block]"
                                 );
                  }
                  uVar11 = pvVar2[uVar12].m_p[uVar8] & 1;
                  this_00 = (this->m_etc1_blocks_etc1s).m_p + uVar6;
                  if ((char)local_bc == '\0') {
                    ppVar3 = (this->m_source_blocks).m_p;
                    lVar7 = 0;
                    do {
                      local_68[lVar7] =
                           ppVar3[uVar6].m_pixels[0]
                           [*(uint *)(g_etc1_pixel_indices +
                                     lVar7 * 4 +
                                     (ulong)(((this_00->field_0).m_bytes[3] & 1) << 6) +
                                     (ulong)(uVar11 << 5))].field_0;
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 8);
                  }
                  else {
                    etc_block::get_block_low_high_colors
                              (this_00,(color_rgba *)&local_90[0].field_1,uVar11);
                    local_68[0] = local_90[uVar11];
                    local_68[1] = local_68[0];
                    local_68[2] = local_68[0];
                    local_68[3] = local_68[0];
                    local_68[4] = local_68[0];
                    local_68[5] = local_68[0];
                    local_68[6] = local_68[0];
                    local_68[7] = local_68[0];
                  }
                  image::set_block_clipped
                            (&local_88,(color_rgba *)&local_68[0].field_1,(int)uVar8 * 5 + 0xc,
                             uVar10,4,2);
                  uVar6 = (this->m_endpoint_clusters).m_size;
                  if (uVar6 <= uVar12) goto LAB_0022bc21;
                  uVar11 = (int)uVar8 + 1;
                  uVar8 = (ulong)uVar11;
                  pvVar2 = (this->m_endpoint_clusters).m_p;
                } while (uVar11 < pvVar2[uVar12].m_size);
              }
              uVar12 = (int)local_98 + 1;
              uVar8 = (ulong)uVar12;
            } while (uVar12 < uVar6);
          }
          pcVar9 = local_a0;
          save_png(local_a0,&local_88,0,0);
          debug_printf("Wrote debug visualization file %s\n",pcVar9);
          if (local_88.m_pixels.m_p != (color_rgba *)0x0) {
            free(local_88.m_pixels.m_p);
          }
        }
      }
      __ptr = local_d8.m_p;
    }
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (local_b8.m_p != (void *)0x0) {
    free(local_b8.m_p);
  }
  return;
}

Assistant:

void basisu_frontend::dump_endpoint_clusterization_visualization(const char *pFilename, bool vis_endpoint_colors)
	{
		debug_printf("dump_endpoint_clusterization_visualization\n");

		uint32_t max_endpoint_cluster_size = 0;

		basisu::vector<uint32_t> cluster_sizes(m_endpoint_clusters.size());
		basisu::vector<uint32_t> sorted_cluster_indices(m_endpoint_clusters.size());
		for (uint32_t i = 0; i < m_endpoint_clusters.size(); i++)
		{
			max_endpoint_cluster_size = maximum<uint32_t>(max_endpoint_cluster_size, (uint32_t)m_endpoint_clusters[i].size());
			cluster_sizes[i] = (uint32_t)m_endpoint_clusters[i].size();
		}

		if (!max_endpoint_cluster_size)
			return;

		for (uint32_t i = 0; i < m_endpoint_clusters.size(); i++)
			sorted_cluster_indices[i] = i;

		//indexed_heap_sort(endpoint_clusters.size(), cluster_sizes.get_ptr(), sorted_cluster_indices.get_ptr());

		image endpoint_cluster_vis(12 + minimum<uint32_t>(max_endpoint_cluster_size, 2048) * 5, (uint32_t)m_endpoint_clusters.size() * 3);

		for (uint32_t unsorted_cluster_iter = 0; unsorted_cluster_iter < m_endpoint_clusters.size(); unsorted_cluster_iter++)
		{
			const uint32_t cluster_iter = sorted_cluster_indices[unsorted_cluster_iter];

			etc_block blk;
			blk.clear();
			blk.set_flip_bit(false);
			blk.set_diff_bit(true);
			blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[cluster_iter].m_inten_table[0]);
			blk.set_base5_color(etc_block::pack_color5(m_endpoint_cluster_etc_params[cluster_iter].m_color_unscaled[0], false));

			color_rgba blk_colors[4];
			blk.get_block_colors(blk_colors, 0);
			for (uint32_t i = 0; i < 4; i++)
				endpoint_cluster_vis.fill_box(i * 2, 3 * unsorted_cluster_iter, 2, 2, blk_colors[i]);

			for (uint32_t subblock_iter = 0; subblock_iter < m_endpoint_clusters[cluster_iter].size(); subblock_iter++)
			{
				uint32_t training_vector_index = m_endpoint_clusters[cluster_iter][subblock_iter];

				const uint32_t block_index = training_vector_index >> 1;
				const uint32_t subblock_index = training_vector_index & 1;

				const etc_block& blk2 = m_etc1_blocks_etc1s[block_index];

				const color_rgba *pBlock_pixels = get_source_pixel_block(block_index).get_ptr();

				color_rgba subblock_pixels[8];

				if (vis_endpoint_colors)
				{
					color_rgba colors[2];
					blk2.get_block_low_high_colors(colors, subblock_index);
					for (uint32_t i = 0; i < 8; i++)
						subblock_pixels[i] = colors[subblock_index];
				}
				else
				{
					for (uint32_t i = 0; i < 8; i++)
						subblock_pixels[i] = pBlock_pixels[g_etc1_pixel_indices[blk2.get_flip_bit()][subblock_index][i]];
				}

				endpoint_cluster_vis.set_block_clipped(subblock_pixels, 12 + 5 * subblock_iter, 3 * unsorted_cluster_iter, 4, 2);
			}
		}

		save_png(pFilename, endpoint_cluster_vis);
		debug_printf("Wrote debug visualization file %s\n", pFilename);
	}